

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void deref_node(trie_node *n)

{
  long lVar1;
  long in_FS_OFFSET;
  trie_node *n_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (n->parent != (trie_node *)0x0) {
    if (n->parent->lchild == n) {
      n->parent->lchild = (trie_node *)0x0;
    }
    else {
      n->parent->rchild = (trie_node *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void deref_node(struct trie_node *n)
{
	if (!n->parent)
		return;

	if (n->parent->lchild == n) {
		n->parent->lchild = NULL;
		return;
	}

	n->parent->rchild = NULL;
}